

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

curltime cf_get_max_baller_time(Curl_cfilter *cf,Curl_easy *data,int query)

{
  void *pvVar1;
  int iVar2;
  timediff_t tVar3;
  curltime newer;
  curltime newer_00;
  curltime cVar4;
  curltime older;
  curltime older_00;
  long *local_60;
  long *local_58;
  Curl_cfilter *local_50;
  curltime t;
  Curl_cfilter *cfb;
  cf_hc_ctx *ctx;
  int query_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  curltime tmax;
  
  pvVar1 = cf->ctx;
  memset(&cf_local,0,0x10);
  memset(&local_50,0,0x10);
  if ((*(byte *)((long)pvVar1 + 0x84) & 1) == 0) {
    local_58 = (long *)0x0;
  }
  else {
    local_58 = *(long **)((long)pvVar1 + 0x60);
  }
  t._8_8_ = local_58;
  if ((((local_58 != (long *)0x0) &&
       (iVar2 = (**(code **)(*local_58 + 0x68))(local_58,data,query,0,&local_50), iVar2 == 0)) &&
      ((local_50 != (Curl_cfilter *)0x0 || ((int)t.tv_sec != 0)))) &&
     (newer.tv_usec = (int)t.tv_sec, newer.tv_sec = (time_t)local_50,
     older.tv_usec = (int)tmax.tv_sec, older.tv_sec = (time_t)cf_local, newer._12_4_ = 0,
     older._12_4_ = 0, tVar3 = Curl_timediff_us(newer,older), 0 < tVar3)) {
    cf_local = local_50;
    tmax.tv_sec._0_4_ = (int)t.tv_sec;
  }
  memset(&local_50,0,0x10);
  if ((*(byte *)((long)pvVar1 + 0x54) & 1) == 0) {
    local_60 = (long *)0x0;
  }
  else {
    local_60 = *(long **)((long)pvVar1 + 0x30);
  }
  t._8_8_ = local_60;
  if (((local_60 != (long *)0x0) &&
      (iVar2 = (**(code **)(*local_60 + 0x68))(local_60,data,query,0,&local_50), iVar2 == 0)) &&
     (((local_50 != (Curl_cfilter *)0x0 || ((int)t.tv_sec != 0)) &&
      (newer_00.tv_usec = (int)t.tv_sec, newer_00.tv_sec = (time_t)local_50,
      older_00.tv_usec = (int)tmax.tv_sec, older_00.tv_sec = (time_t)cf_local, newer_00._12_4_ = 0,
      older_00._12_4_ = 0, tVar3 = Curl_timediff_us(newer_00,older_00), 0 < tVar3)))) {
    cf_local = local_50;
    tmax.tv_sec._0_4_ = (int)t.tv_sec;
  }
  cVar4.tv_usec = (int)tmax.tv_sec;
  cVar4.tv_sec = (time_t)cf_local;
  cVar4._12_4_ = 0;
  return cVar4;
}

Assistant:

static struct curltime cf_get_max_baller_time(struct Curl_cfilter *cf,
                                              struct Curl_easy *data,
                                              int query)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct Curl_cfilter *cfb;
  struct curltime t, tmax;

  memset(&tmax, 0, sizeof(tmax));
  memset(&t, 0, sizeof(t));
  cfb = ctx->h21_baller.enabled? ctx->h21_baller.cf : NULL;
  if(cfb && !cfb->cft->query(cfb, data, query, NULL, &t)) {
    if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
      tmax = t;
  }
  memset(&t, 0, sizeof(t));
  cfb = ctx->h3_baller.enabled? ctx->h3_baller.cf : NULL;
  if(cfb && !cfb->cft->query(cfb, data, query, NULL, &t)) {
    if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
      tmax = t;
  }
  return tmax;
}